

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

xmlHashTablePtr
xmlHashCopySafe(xmlHashTablePtr hash,xmlHashCopier copyFunc,xmlHashDeallocator deallocFunc)

{
  uint uVar1;
  xmlHashEntry *pxVar2;
  int iVar3;
  void *payload;
  void *copy;
  xmlHashTablePtr ret;
  xmlHashEntry *end;
  xmlHashEntry *entry;
  xmlHashDeallocator deallocFunc_local;
  xmlHashCopier copyFunc_local;
  xmlHashTablePtr hash_local;
  
  if ((hash == (xmlHashTablePtr)0x0) || (copyFunc == (xmlHashCopier)0x0)) {
    hash_local = (xmlHashTablePtr)0x0;
  }
  else {
    hash_local = xmlHashCreate(hash->size);
    if (hash_local == (xmlHashTablePtr)0x0) {
      hash_local = (xmlHashTablePtr)0x0;
    }
    else if (hash->size != 0) {
      pxVar2 = hash->table;
      uVar1 = hash->size;
      for (end = hash->table; end < pxVar2 + uVar1; end = end + 1) {
        if (end->hashValue != 0) {
          payload = (*copyFunc)(end->payload,end->key);
          if (payload == (void *)0x0) {
LAB_00138e8c:
            xmlHashFree(hash_local,deallocFunc);
            return (xmlHashTablePtr)0x0;
          }
          iVar3 = xmlHashAdd3(hash_local,end->key,end->key2,end->key3,payload);
          if (iVar3 < 1) {
            if (deallocFunc != (xmlHashDeallocator)0x0) {
              (*deallocFunc)(payload,end->key);
            }
            goto LAB_00138e8c;
          }
        }
      }
    }
  }
  return hash_local;
}

Assistant:

xmlHashTablePtr
xmlHashCopySafe(xmlHashTablePtr hash, xmlHashCopier copyFunc,
                xmlHashDeallocator deallocFunc) {
    const xmlHashEntry *entry, *end;
    xmlHashTablePtr ret;

    if ((hash == NULL) || (copyFunc == NULL))
        return(NULL);

    ret = xmlHashCreate(hash->size);
    if (ret == NULL)
        return(NULL);

    if (hash->size == 0)
        return(ret);

    end = &hash->table[hash->size];

    for (entry = hash->table; entry < end; entry++) {
        if (entry->hashValue != 0) {
            void *copy;

            copy = copyFunc(entry->payload, entry->key);
            if (copy == NULL)
                goto error;
            if (xmlHashAdd3(ret, entry->key, entry->key2, entry->key3,
                            copy) <= 0) {
                if (deallocFunc != NULL)
                    deallocFunc(copy, entry->key);
                goto error;
            }
        }
    }

    return(ret);

error:
    xmlHashFree(ret, deallocFunc);
    return(NULL);
}